

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[5],std::__cxx11::string,char>
          (JObject *this,char (*k) [5],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,char *c)

{
  ostream *os;
  undefined1 local_40 [8];
  Field<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  field;
  
  local_40 = (undefined1  [8])k;
  field.k = (char (*) [5])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                         *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }